

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O3

ts_nsec timed_fdb_snapshot(fdb_kvs_handle *kv,fdb_kvs_handle **snap_kv)

{
  fdb_status fVar1;
  ts_nsec tVar2;
  ts_nsec tVar3;
  long lVar4;
  long lVar5;
  
  tVar2 = get_monotonic_ts();
  fVar1 = fdb_snapshot_open(kv,snap_kv,0xffffffffffffffff);
  tVar3 = get_monotonic_ts();
  lVar4 = 0xffffffff;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    lVar5 = tVar3 - tVar2;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    lVar4 = lVar4 / 1000;
  }
  return lVar4;
}

Assistant:

ts_nsec timed_fdb_snapshot(fdb_kvs_handle *kv, fdb_kvs_handle **snap_kv){

    ts_nsec start, end;
    fdb_status status;

    start = get_monotonic_ts();
    status = fdb_snapshot_open(kv, snap_kv, FDB_SNAPSHOT_INMEM);
    end = get_monotonic_ts();

    if(status == FDB_RESULT_SUCCESS){
      return ts_diff(start, end);
    } else {
      return ERR_NS;
    }

}